

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::Validator::validate
          (Validator *this,Reader *type,Reader *value,uint *dataSizeInBits,bool *isPointer)

{
  uint uVar1;
  undefined2 uVar2;
  uint uVar3;
  bool bVar4;
  Which expectedValueType;
  uint local_60;
  uint local_5c;
  DebugComparison<capnp::schema::Value::Which,_capnp::schema::Value::Which_&> _kjCondition;
  Fault f;
  
  validate(this,type);
  if ((type->_reader).dataSize < 0x10) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(type->_reader).data;
  }
  switch(uVar2) {
  case 0:
    expectedValueType = VOID;
    uVar3 = 0;
    break;
  case 1:
    expectedValueType = BOOL;
    uVar3 = 1;
    break;
  case 2:
    expectedValueType = INT8;
    goto LAB_001a72ac;
  case 3:
    expectedValueType = INT16;
    goto LAB_001a7270;
  case 4:
    expectedValueType = INT32;
    goto LAB_001a72d0;
  case 5:
    expectedValueType = INT64;
    goto LAB_001a7295;
  case 6:
    expectedValueType = UINT8;
LAB_001a72ac:
    uVar3 = 8;
    break;
  case 7:
    expectedValueType = UINT16;
    goto LAB_001a7270;
  case 8:
    expectedValueType = UINT32;
    goto LAB_001a72d0;
  case 9:
    expectedValueType = UINT64;
    goto LAB_001a7295;
  case 10:
    expectedValueType = FLOAT32;
LAB_001a72d0:
    uVar3 = 0x20;
    break;
  case 0xb:
    expectedValueType = FLOAT64;
LAB_001a7295:
    uVar3 = 0x40;
    break;
  case 0xc:
    expectedValueType = TEXT;
    goto LAB_001a72ba;
  case 0xd:
    expectedValueType = DATA;
    goto LAB_001a72ba;
  case 0xe:
    expectedValueType = LIST;
    goto LAB_001a72ba;
  case 0xf:
    expectedValueType = ENUM;
LAB_001a7270:
    uVar3 = 0x10;
    break;
  case 0x10:
    expectedValueType = STRUCT;
    goto LAB_001a72ba;
  case 0x11:
    expectedValueType = INTERFACE;
    goto LAB_001a72ba;
  case 0x12:
    expectedValueType = ANY_POINTER;
LAB_001a72ba:
    bVar4 = true;
    uVar3 = 0;
    goto LAB_001a72d7;
  default:
    goto switchD_001a71ff_default;
  }
  bVar4 = false;
LAB_001a72d7:
  *dataSizeInBits = uVar3;
  *isPointer = bVar4;
  uVar1 = (value->_reader).dataSize;
  if (uVar1 < 0x10) {
    _kjCondition.left = VOID;
  }
  else {
    _kjCondition.left = *(value->_reader).data;
  }
  _kjCondition.right = &expectedValueType;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == expectedValueType;
  if (!_kjCondition.result) {
    local_5c = 0;
    if (0xf < uVar1) {
      local_5c = (uint)*(value->_reader).data;
    }
    local_60 = (uint)expectedValueType;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Value::Which,capnp::schema::Value::Which&>&,char_const(&)[26],unsigned_int,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,500,FAILED,"value.which() == expectedValueType",
               "_kjCondition,\"Value did not match type.\", (uint)value.which(), (uint)expectedValueType"
               ,&_kjCondition,(char (*) [26])"Value did not match type.",&local_5c,&local_60);
    this->isValid = false;
    kj::_::Debug::Fault::~Fault(&f);
  }
switchD_001a71ff_default:
  return;
}

Assistant:

void validate(const schema::Type::Reader& type, const schema::Value::Reader& value,
                uint* dataSizeInBits, bool* isPointer) {
    validate(type);

    schema::Value::Which expectedValueType = schema::Value::VOID;
    bool hadCase = false;
    switch (type.which()) {
#define HANDLE_TYPE(name, bits, ptr) \
      case schema::Type::name: \
        expectedValueType = schema::Value::name; \
        *dataSizeInBits = bits; *isPointer = ptr; \
        hadCase = true; \
        break;
      HANDLE_TYPE(VOID, 0, false)
      HANDLE_TYPE(BOOL, 1, false)
      HANDLE_TYPE(INT8, 8, false)
      HANDLE_TYPE(INT16, 16, false)
      HANDLE_TYPE(INT32, 32, false)
      HANDLE_TYPE(INT64, 64, false)
      HANDLE_TYPE(UINT8, 8, false)
      HANDLE_TYPE(UINT16, 16, false)
      HANDLE_TYPE(UINT32, 32, false)
      HANDLE_TYPE(UINT64, 64, false)
      HANDLE_TYPE(FLOAT32, 32, false)
      HANDLE_TYPE(FLOAT64, 64, false)
      HANDLE_TYPE(TEXT, 0, true)
      HANDLE_TYPE(DATA, 0, true)
      HANDLE_TYPE(LIST, 0, true)
      HANDLE_TYPE(ENUM, 16, false)
      HANDLE_TYPE(STRUCT, 0, true)
      HANDLE_TYPE(INTERFACE, 0, true)
      HANDLE_TYPE(ANY_POINTER, 0, true)
#undef HANDLE_TYPE
    }

    if (hadCase) {
      VALIDATE_SCHEMA(value.which() == expectedValueType, "Value did not match type.",
                      (uint)value.which(), (uint)expectedValueType);
    }
  }